

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O3

bool __thiscall mp::NLSuffix::operator<(NLSuffix *this,NLSuffix *s)

{
  pointer pcVar1;
  long *__s2;
  long *__s1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  difference_type __d;
  long *local_80;
  ulong local_78;
  long local_70 [2];
  uint local_60;
  long *local_58;
  ulong local_50;
  long local_48 [2];
  uint local_38;
  
  uVar3 = this->kind_;
  local_80 = local_70;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar1,pcVar1 + (this->name_)._M_string_length);
  uVar6 = s->kind_;
  local_58 = local_48;
  pcVar1 = (s->name_)._M_dataplus._M_p;
  local_60 = uVar3 & 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (s->name_)._M_string_length);
  __s1 = local_58;
  __s2 = local_80;
  uVar6 = uVar6 & 3;
  uVar4 = local_78;
  if (local_50 < local_78) {
    uVar4 = local_50;
  }
  local_38 = uVar6;
  if (uVar4 == 0) {
    if ((long)(local_78 - local_50) < 0) {
LAB_001196a3:
      bVar5 = true;
      goto LAB_001196a9;
    }
LAB_00119677:
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_50 - local_78)) {
      uVar4 = local_50 - local_78;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
  }
  else {
    iVar2 = memcmp(local_80,local_58,uVar4);
    if (iVar2 == 0) {
      if ((long)(local_78 - local_50) < 0) goto LAB_001196a3;
    }
    else {
      bVar5 = true;
      if (iVar2 < 0) goto LAB_001196a9;
    }
    uVar3 = memcmp(__s1,__s2,uVar4);
    uVar4 = (ulong)uVar3;
    if (uVar3 == 0) goto LAB_00119677;
  }
  if ((int)uVar4 < 0) {
    bVar5 = false;
  }
  else {
    bVar5 = (int)local_60 < (int)uVar6;
  }
LAB_001196a9:
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return bVar5;
}

Assistant:

bool operator<(const NLSuffix& s) const {
    return std::make_pair(name_, kind_&3)
        < std::make_pair(s.name_, s.kind_&3);
  }